

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-oid.c
# Opt level: O0

void test_bson_oid_init_sequence_with_tid(void)

{
  uint uVar1;
  undefined8 uVar2;
  int local_2c;
  undefined1 local_28 [4];
  int i;
  bson_oid_t oid2;
  bson_oid_t oid;
  bson_context_t *context;
  
  uVar2 = bson_context_new(8);
  bson_oid_init_sequence(oid2.bytes + 4,uVar2);
  local_2c = 0;
  while( true ) {
    if (9999 < local_2c) {
      bson_context_destroy(uVar2);
      return;
    }
    bson_oid_init_sequence(local_28,uVar2);
    uVar1 = bson_oid_equal(oid2.bytes + 4,local_28);
    if ((uVar1 & 1) != 0) break;
    uVar1 = bson_oid_compare(oid2.bytes + 4,local_28);
    if (uVar1 < 0x80000000) {
      fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-oid.c"
              ,0x105,"test_bson_oid_init_sequence_with_tid","0 > bson_oid_compare (&oid, &oid2)");
      abort();
    }
    bson_oid_copy(local_28,oid2.bytes + 4);
    local_2c = local_2c + 1;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-oid.c",
          0x104,"test_bson_oid_init_sequence_with_tid","false == bson_oid_equal (&oid, &oid2)");
  abort();
}

Assistant:

static void
test_bson_oid_init_sequence_with_tid (void)
{
   bson_context_t *context;
   bson_oid_t oid;
   bson_oid_t oid2;
   int i;

   context = bson_context_new (BSON_CONTEXT_USE_TASK_ID);
   bson_oid_init_sequence (&oid, context);
   for (i = 0; i < 10000; i++) {
      bson_oid_init_sequence (&oid2, context);
      BSON_ASSERT (false == bson_oid_equal (&oid, &oid2));
      BSON_ASSERT (0 > bson_oid_compare (&oid, &oid2));
      bson_oid_copy (&oid2, &oid);
   }
   bson_context_destroy (context);
}